

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O1

LIBSSH2_AGENT * libssh2_agent_init(LIBSSH2_SESSION *session)

{
  LIBSSH2_AGENT *pLVar1;
  
  pLVar1 = (LIBSSH2_AGENT *)_libssh2_calloc(session,0x68);
  if (pLVar1 == (LIBSSH2_AGENT *)0x0) {
    _libssh2_error(session,-6,"Unable to allocate space for agent connection");
    pLVar1 = (LIBSSH2_AGENT *)0x0;
  }
  else {
    pLVar1->fd = -1;
    pLVar1->session = session;
    pLVar1->identity_agent_path = (char *)0x0;
    _libssh2_list_init(&pLVar1->head);
  }
  return pLVar1;
}

Assistant:

LIBSSH2_API LIBSSH2_AGENT *
libssh2_agent_init(LIBSSH2_SESSION *session)
{
    LIBSSH2_AGENT *agent;

    agent = LIBSSH2_CALLOC(session, sizeof(*agent));
    if(!agent) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate space for agent connection");
        return NULL;
    }
    agent->fd = LIBSSH2_INVALID_SOCKET;
    agent->session = session;
    agent->identity_agent_path = NULL;
    _libssh2_list_init(&agent->head);

#ifdef HAVE_WIN32_AGENTS
    agent->pipe = INVALID_HANDLE_VALUE;
    memset(&agent->overlapped, 0, sizeof(OVERLAPPED));
    agent->pending_io = FALSE;
#endif

    return agent;
}